

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

HierarchyInstantiationSyntax * __thiscall
slang::parsing::Parser::parseHierarchyInstantiation(Parser *this,AttrList attributes)

{
  size_t *psVar1;
  uchar *puVar2;
  group_type_pointer pgVar3;
  size_type sVar4;
  undefined1 auVar5 [16];
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  size_t sVar22;
  char *pcVar23;
  value_type_pointer pbVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  bool bVar41;
  int iVar42;
  uint uVar43;
  uint64_t uVar44;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar45;
  undefined4 extraout_var;
  HierarchyInstantiationSyntax *pHVar46;
  ulong uVar47;
  long lVar48;
  Info *extraout_RDX;
  Info *src;
  TokenKind kind;
  size_type __rlen;
  ulong pos0;
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *set;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  size_type __rlen_1;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  Token TVar68;
  Token TVar69;
  Token TVar70;
  size_t pos;
  string_view name;
  value_type *elements;
  Token semi;
  Token type;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  string_view local_238;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_228;
  group_type_pointer local_220;
  long local_218;
  value_type_pointer local_210;
  uint64_t local_208;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_200;
  Token local_1f8;
  uchar local_1e8;
  uchar uStack_1e7;
  uchar uStack_1e6;
  uchar uStack_1e5;
  uchar uStack_1e4;
  uchar uStack_1e3;
  uchar uStack_1e2;
  uchar uStack_1e1;
  uchar uStack_1e0;
  uchar uStack_1df;
  uchar uStack_1de;
  uchar uStack_1dd;
  uchar uStack_1dc;
  uchar uStack_1db;
  uchar uStack_1da;
  uchar uStack_1d9;
  size_t local_1d0;
  ParameterValueAssignmentSyntax *local_1c8;
  pointer local_1c0;
  size_t local_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1b0;
  undefined1 local_1a0 [16];
  size_t local_190;
  pointer local_188;
  size_t local_180;
  Token local_178;
  uchar local_168;
  uchar uStack_167;
  uchar uStack_166;
  uchar uStack_165;
  uchar uStack_164;
  uchar uStack_163;
  uchar uStack_162;
  uchar uStack_161;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  uchar uStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  uchar uStack_159;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  uchar uStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  uchar uStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  uchar uStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  uchar uStack_149;
  undefined1 local_140 [40];
  pointer local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  local_1b8 = (size_t)attributes._M_extent._M_extent_value;
  local_1c0 = attributes._M_ptr;
  local_178 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1c8 = parseParameterValueAssignment(this);
  local_238 = Token::valueText(&local_178);
  if ((local_238._M_len != 0) && (local_178.kind == Identifier)) {
    sVar4 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    if (sVar4 != 0) {
      this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .data_;
      local_228 = this_00 + sVar4 * 0x30;
      do {
        uVar44 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (this_00,&local_238);
        uVar47 = uVar44 >> ((byte)*this_00 & 0x3f);
        local_218 = *(long *)(this_00 + 0x10);
        lVar48 = (uVar44 & 0xff) * 4;
        uVar52 = (&UNK_0047072c)[lVar48];
        uVar53 = (&UNK_0047072d)[lVar48];
        uVar54 = (&UNK_0047072e)[lVar48];
        uVar55 = (&UNK_0047072f)[lVar48];
        sVar22 = local_238._M_len;
        pcVar23 = local_238._M_str;
        local_220 = (group_type_pointer)(ulong)((uint)uVar44 & 7);
        uVar49 = 0;
        uVar56 = uVar52;
        uVar57 = uVar53;
        uVar58 = uVar54;
        uVar59 = uVar55;
        uVar60 = uVar52;
        uVar61 = uVar53;
        uVar62 = uVar54;
        uVar63 = uVar55;
        uVar64 = uVar52;
        uVar65 = uVar53;
        uVar66 = uVar54;
        uVar67 = uVar55;
        do {
          puVar2 = (uchar *)(local_218 + uVar47 * 0x10);
          local_158 = *puVar2;
          uStack_157 = puVar2[1];
          uStack_156 = puVar2[2];
          uStack_155 = puVar2[3];
          uStack_154 = puVar2[4];
          uStack_153 = puVar2[5];
          uStack_152 = puVar2[6];
          uStack_151 = puVar2[7];
          uStack_150 = puVar2[8];
          uStack_14f = puVar2[9];
          uStack_14e = puVar2[10];
          uStack_14d = puVar2[0xb];
          uStack_14c = puVar2[0xc];
          uStack_14b = puVar2[0xd];
          uStack_14a = puVar2[0xe];
          uStack_149 = puVar2[0xf];
          auVar50[0] = -(local_158 == uVar52);
          auVar50[1] = -(uStack_157 == uVar53);
          auVar50[2] = -(uStack_156 == uVar54);
          auVar50[3] = -(uStack_155 == uVar55);
          auVar50[4] = -(uStack_154 == uVar56);
          auVar50[5] = -(uStack_153 == uVar57);
          auVar50[6] = -(uStack_152 == uVar58);
          auVar50[7] = -(uStack_151 == uVar59);
          auVar50[8] = -(uStack_150 == uVar60);
          auVar50[9] = -(uStack_14f == uVar61);
          auVar50[10] = -(uStack_14e == uVar62);
          auVar50[0xb] = -(uStack_14d == uVar63);
          auVar50[0xc] = -(uStack_14c == uVar64);
          auVar50[0xd] = -(uStack_14b == uVar65);
          auVar50[0xe] = -(uStack_14a == uVar66);
          auVar50[0xf] = -(uStack_149 == uVar67);
          local_210 = (value_type_pointer)CONCAT71(local_210._1_7_,uStack_149);
          uVar43 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe);
          if (uVar43 != 0) {
            lVar48 = *(long *)(this_00 + 0x18) + uVar47 * 0xf0;
            local_1e8 = uVar52;
            uStack_1e7 = uVar53;
            uStack_1e6 = uVar54;
            uStack_1e5 = uVar55;
            uStack_1e4 = uVar56;
            uStack_1e3 = uVar57;
            uStack_1e2 = uVar58;
            uStack_1e1 = uVar59;
            uStack_1e0 = uVar60;
            uStack_1df = uVar61;
            uStack_1de = uVar62;
            uStack_1dd = uVar63;
            uStack_1dc = uVar64;
            uStack_1db = uVar65;
            uStack_1da = uVar66;
            uStack_1d9 = uVar67;
            do {
              iVar42 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
                }
              }
              if ((sVar22 == *(size_t *)(lVar48 + (ulong)(uint)(iVar42 << 4))) &&
                 ((sVar22 == 0 ||
                  (iVar42 = bcmp(pcVar23,*(void **)(lVar48 + 8 + (ulong)(uint)(iVar42 << 4)),sVar22)
                  , uVar52 = local_1e8, uVar53 = uStack_1e7, uVar54 = uStack_1e6,
                  uVar55 = uStack_1e5, uVar56 = uStack_1e4, uVar57 = uStack_1e3, uVar58 = uStack_1e2
                  , uVar59 = uStack_1e1, uVar60 = uStack_1e0, uVar61 = uStack_1df,
                  uVar62 = uStack_1de, uVar63 = uStack_1dd, uVar64 = uStack_1dc, uVar65 = uStack_1db
                  , uVar66 = uStack_1da, uVar67 = uStack_1d9, iVar42 == 0)))) goto LAB_003a71c2;
              uVar43 = uVar43 - 1 & uVar43;
            } while (uVar43 != 0);
          }
          if ((local_220[0x470b2].m[0].n & (byte)local_210) == 0) break;
          lVar48 = uVar47 + uVar49;
          uVar49 = uVar49 + 1;
          uVar47 = lVar48 + 1U & *(ulong *)(this_00 + 8);
        } while (uVar49 <= *(ulong *)(this_00 + 8));
        this_00 = this_00 + 0x30;
      } while (this_00 != local_228);
    }
    local_200 = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                 *)&(this->meta).globalInstances;
    local_208 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                          ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                           local_200,&local_238);
    pos0 = local_208 >>
           ((byte)(this->meta).globalInstances.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .arrays.groups_size_index & 0x3f);
    local_220 = (this->meta).globalInstances.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_;
    lVar48 = (local_208 & 0xff) * 4;
    uVar52 = (&UNK_0047072c)[lVar48];
    uVar53 = (&UNK_0047072d)[lVar48];
    uVar54 = (&UNK_0047072e)[lVar48];
    uVar55 = (&UNK_0047072f)[lVar48];
    local_210 = (this->meta).globalInstances.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.elements_;
    sVar22 = local_238._M_len;
    pcVar23 = local_238._M_str;
    local_228 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (ulong)((uint)local_208 & 7);
    local_1d0 = (this->meta).globalInstances.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_size_mask;
    uVar49 = 0;
    uVar47 = pos0;
    uVar56 = uVar52;
    uVar57 = uVar53;
    uVar58 = uVar54;
    uVar59 = uVar55;
    uVar60 = uVar52;
    uVar61 = uVar53;
    uVar62 = uVar54;
    uVar63 = uVar55;
    uVar64 = uVar52;
    uVar65 = uVar53;
    uVar66 = uVar54;
    uVar67 = uVar55;
    do {
      pbVar24 = local_210;
      pgVar3 = local_220 + uVar47;
      local_168 = pgVar3->m[0].n;
      uStack_167 = pgVar3->m[1].n;
      uStack_166 = pgVar3->m[2].n;
      uStack_165 = pgVar3->m[3].n;
      uStack_164 = pgVar3->m[4].n;
      uStack_163 = pgVar3->m[5].n;
      uStack_162 = pgVar3->m[6].n;
      uStack_161 = pgVar3->m[7].n;
      uStack_160 = pgVar3->m[8].n;
      uStack_15f = pgVar3->m[9].n;
      uStack_15e = pgVar3->m[10].n;
      uStack_15d = pgVar3->m[0xb].n;
      uStack_15c = pgVar3->m[0xc].n;
      uStack_15b = pgVar3->m[0xd].n;
      uStack_15a = pgVar3->m[0xe].n;
      uStack_159 = pgVar3->m[0xf].n;
      auVar51[0] = -(local_168 == uVar52);
      auVar51[1] = -(uStack_167 == uVar53);
      auVar51[2] = -(uStack_166 == uVar54);
      auVar51[3] = -(uStack_165 == uVar55);
      auVar51[4] = -(uStack_164 == uVar56);
      auVar51[5] = -(uStack_163 == uVar57);
      auVar51[6] = -(uStack_162 == uVar58);
      auVar51[7] = -(uStack_161 == uVar59);
      auVar51[8] = -(uStack_160 == uVar60);
      auVar51[9] = -(uStack_15f == uVar61);
      auVar51[10] = -(uStack_15e == uVar62);
      auVar51[0xb] = -(uStack_15d == uVar63);
      auVar51[0xc] = -(uStack_15c == uVar64);
      auVar51[0xd] = -(uStack_15b == uVar65);
      auVar51[0xe] = -(uStack_15a == uVar66);
      auVar51[0xf] = -(uStack_159 == uVar67);
      local_218 = CONCAT71(local_218._1_7_,uStack_159);
      uVar25 = uVar52;
      uVar26 = uVar53;
      uVar27 = uVar54;
      uVar28 = uVar55;
      uVar29 = uVar56;
      uVar30 = uVar57;
      uVar31 = uVar58;
      uVar32 = uVar59;
      uVar33 = uVar60;
      uVar34 = uVar61;
      uVar35 = uVar62;
      uVar36 = uVar63;
      uVar37 = uVar64;
      uVar38 = uVar65;
      uVar39 = uVar66;
      uVar40 = uVar67;
      uVar6 = local_1e8;
      uVar7 = uStack_1e7;
      uVar8 = uStack_1e6;
      uVar9 = uStack_1e5;
      uVar10 = uStack_1e4;
      uVar11 = uStack_1e3;
      uVar12 = uStack_1e2;
      uVar13 = uStack_1e1;
      uVar14 = uStack_1e0;
      uVar15 = uStack_1df;
      uVar16 = uStack_1de;
      uVar17 = uStack_1dd;
      uVar18 = uStack_1dc;
      uVar19 = uStack_1db;
      uVar20 = uStack_1da;
      uVar21 = uStack_1d9;
      for (uVar43 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe);
          uStack_1d9 = uVar40, uStack_1da = uVar39, uStack_1db = uVar38, uStack_1dc = uVar37,
          uStack_1dd = uVar36, uStack_1de = uVar35, uStack_1df = uVar34, uStack_1e0 = uVar33,
          uStack_1e1 = uVar32, uStack_1e2 = uVar31, uStack_1e3 = uVar30, uStack_1e4 = uVar29,
          uStack_1e5 = uVar28, uStack_1e6 = uVar27, uStack_1e7 = uVar26, local_1e8 = uVar25,
          uVar43 != 0; uVar43 = uVar43 - 1 & uVar43) {
        iVar42 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
          }
        }
        if ((sVar22 == *(size_t *)((long)&pbVar24[uVar47 * 0xf]._M_len + (ulong)(uint)(iVar42 << 4))
            ) && ((sVar22 == 0 ||
                  (iVar42 = bcmp(pcVar23,*(void **)((long)&pbVar24[uVar47 * 0xf]._M_str +
                                                   (ulong)(uint)(iVar42 << 4)),sVar22),
                  uVar52 = local_1e8, uVar53 = uStack_1e7, uVar54 = uStack_1e6, uVar55 = uStack_1e5,
                  uVar56 = uStack_1e4, uVar57 = uStack_1e3, uVar58 = uStack_1e2, uVar59 = uStack_1e1
                  , uVar60 = uStack_1e0, uVar61 = uStack_1df, uVar62 = uStack_1de,
                  uVar63 = uStack_1dd, uVar64 = uStack_1dc, uVar65 = uStack_1db, uVar66 = uStack_1da
                  , uVar67 = uStack_1d9, iVar42 == 0)))) goto LAB_003a71c2;
        uVar25 = local_1e8;
        uVar26 = uStack_1e7;
        uVar27 = uStack_1e6;
        uVar28 = uStack_1e5;
        uVar29 = uStack_1e4;
        uVar30 = uStack_1e3;
        uVar31 = uStack_1e2;
        uVar32 = uStack_1e1;
        uVar33 = uStack_1e0;
        uVar34 = uStack_1df;
        uVar35 = uStack_1de;
        uVar36 = uStack_1dd;
        uVar37 = uStack_1dc;
        uVar38 = uStack_1db;
        uVar39 = uStack_1da;
        uVar40 = uStack_1d9;
        uVar6 = local_1e8;
        uVar7 = uStack_1e7;
        uVar8 = uStack_1e6;
        uVar9 = uStack_1e5;
        uVar10 = uStack_1e4;
        uVar11 = uStack_1e3;
        uVar12 = uStack_1e2;
        uVar13 = uStack_1e1;
        uVar14 = uStack_1e0;
        uVar15 = uStack_1df;
        uVar16 = uStack_1de;
        uVar17 = uStack_1dd;
        uVar18 = uStack_1dc;
        uVar19 = uStack_1db;
        uVar20 = uStack_1da;
        uVar21 = uStack_1d9;
      }
      local_1e8 = uVar6;
      uStack_1e7 = uVar7;
      uStack_1e6 = uVar8;
      uStack_1e5 = uVar9;
      uStack_1e4 = uVar10;
      uStack_1e3 = uVar11;
      uStack_1e2 = uVar12;
      uStack_1e1 = uVar13;
      uStack_1e0 = uVar14;
      uStack_1df = uVar15;
      uStack_1de = uVar16;
      uStack_1dd = uVar17;
      uStack_1dc = uVar18;
      uStack_1db = uVar19;
      uStack_1da = uVar20;
      uStack_1d9 = uVar21;
      if (((byte)*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  ((long)local_228 + 0x470b20) & (byte)local_218) == 0) break;
      lVar48 = uVar47 + uVar49;
      uVar49 = uVar49 + 1;
      uVar47 = lVar48 + 1U & local_1d0;
    } while (uVar49 <= local_1d0);
    if ((this->meta).globalInstances.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (this->meta).globalInstances.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)local_108,local_200,(arrays_type *)local_200,pos0,local_208,&local_238);
      psVar1 = &(this->meta).globalInstances.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)local_108,local_200,local_208,&local_238);
    }
  }
LAB_003a71c2:
  Token::Token(&local_1f8);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  TVar68 = ParserBase::peek(&this->super_ParserBase);
  local_140._0_16_ = (undefined1  [16])TVar68;
  bVar41 = slang::syntax::SyntaxFacts::isSemicolon(TVar68.kind);
  if (bVar41) {
    bVar41 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar41) {
      location = Token::location((Token *)local_140);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
  }
  else {
    bVar41 = slang::syntax::SyntaxFacts::isPossibleInstance(TVar68.kind);
    if (!bVar41) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar68,Semicolon,&local_1f8,(DiagCode)0x400005);
      src = extraout_RDX;
      goto LAB_003a73c4;
    }
    local_1b0._M_rest =
         (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseHierarchicalInstance(this);
    local_1a0[0] = 1;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_108,(TokenOrSyntax *)&local_1b0._M_first);
    TVar69 = ParserBase::peek(&this->super_ParserBase);
    bVar41 = slang::syntax::SyntaxFacts::isSemicolon(TVar69.kind);
    if (TVar69.kind == Comma && !bVar41) {
      do {
        local_1b0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        auVar5[0xf] = 0;
        auVar5._0_15_ = local_1a0._1_15_;
        local_1a0 = auVar5 << 8;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_1b0._M_first);
        TVar69 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar69.kind;
        bVar41 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar41) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar68.info == TVar69.info && TVar68.kind == kind) &&
           (bVar41 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x400005,true), !bVar41)) break;
        pHVar45 = parseHierarchicalInstance(this);
        local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar45;
        local_1a0[0] = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_1b0._M_first);
        TVar70 = ParserBase::peek(&this->super_ParserBase);
        bVar41 = slang::syntax::SyntaxFacts::isSemicolon(TVar70.kind);
        uVar47 = TVar69._0_8_ & 0xffffffff;
        TVar68.info = TVar69.info;
        TVar68.kind = (short)uVar47;
        TVar68._2_1_ = (char)(uVar47 >> 0x10);
        TVar68.numFlags.raw = (char)(uVar47 >> 0x18);
        TVar68.rawLen = (int)(uVar47 >> 0x20);
      } while (TVar70.kind == Comma && !bVar41);
    }
  }
  local_1f8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = local_1f8.info;
LAB_003a73c4:
  TVar68 = local_178;
  local_1b0._8_4_ = 1;
  local_1a0 = (undefined1  [16])0x0;
  local_190 = local_1b8;
  local_188 = local_1c0;
  local_180 = local_1b8;
  local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005c7a10;
  iVar42 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                     (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar42);
  local_140._8_4_ = 3;
  local_140._16_16_ = (undefined1  [16])0x0;
  local_140._0_8_ = &PTR_getChild_005c79b8;
  pHVar46 = slang::syntax::SyntaxFactory::hierarchyInstantiation
                      (&this->factory,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_1b0._M_first,
                       TVar68,local_1c8,
                       (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)local_140,
                       local_1f8);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pHVar46;
}

Assistant:

HierarchyInstantiationSyntax& Parser::parseHierarchyInstantiation(AttrList attributes) {
    auto type = expect(TokenKind::Identifier);
    auto parameters = parseParameterValueAssignment();

    // If this is an instantiation of a global module/interface/program,
    // keep track of it in our instantiatedModules set.
    std::string_view name = type.valueText();
    if (!name.empty() && type.kind == TokenKind::Identifier) {
        bool found = false;
        for (auto& set : moduleDeclStack) {
            if (set.find(name) != set.end()) {
                found = true;
                break;
            }
        }
        if (!found)
            meta.globalInstances.emplace(name);
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.hierarchyInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}